

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O2

bool rr::LineRasterUtil::lineInCornerOutsideAngleRange
               (SubpixelLineSegment *line,Vector<long,_2> *cornerExitNormal)

{
  long lVar1;
  bool bVar2;
  Vector<long,_2> v;
  long local_20;
  long local_18;
  
  SubpixelLineSegment::direction((SubpixelLineSegment *)&local_20);
  lVar1 = tcu::dot<long,2>((Vector<long,_2> *)&local_20,cornerExitNormal);
  bVar2 = true;
  if (lVar1 < 0) {
    bVar2 = lVar1 * lVar1 * 2 <
            (cornerExitNormal->m_data[0] * cornerExitNormal->m_data[0] +
            cornerExitNormal->m_data[1] * cornerExitNormal->m_data[1]) *
            (local_20 * local_20 + local_18 * local_18);
  }
  return bVar2;
}

Assistant:

bool lineInCornerOutsideAngleRange (const SubpixelLineSegment& line, const tcu::Vector<deInt64,2>& cornerExitNormal)
{
	// v0 -> v1 has angle difference to cornerExitNormal in range (-135, 135)
	const tcu::Vector<deInt64,2> v = line.direction();
	const deInt64 dotProduct = dot(v, cornerExitNormal);

	// dotProduct > -|v1-v0|*|cornerExitNormal|/sqrt(2)
	if (dotProduct >= 0)
		return true;
	return 2 * (-dotProduct) * (-dotProduct) < tcu::lengthSquared(v)*tcu::lengthSquared(cornerExitNormal);
}